

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
               *this,GetterYs<unsigned_short> *getter1,GetterYRef *getter2,
              TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  GetterYRef *pGVar6;
  TransformerLinLog *pTVar7;
  double dVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar4 = getter1->Count;
  iVar10 = getter2->Count;
  if (iVar4 < getter2->Count) {
    iVar10 = iVar4;
  }
  this->Prims = iVar10 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar9 = GImPlot;
  (this->P12).y = 0.0;
  dVar1 = getter1->XScale;
  dVar2 = getter1->X0;
  dVar8 = log10((double)*(ushort *)
                         ((long)getter1->Ys +
                         (long)((getter1->Offset % iVar4 + iVar4) % iVar4) * (long)getter1->Stride)
                / GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar4 = transformer->YAxis;
  pIVar5 = pIVar9->CurrentPlot;
  dVar3 = pIVar5->YAxis[iVar4].Range.Min;
  IVar11.x = (float)(((dVar1 * 0.0 + dVar2) - (pIVar5->XAxis).Range.Min) * pIVar9->Mx +
                    (double)pIVar9->PixelRange[iVar4].Min.x);
  IVar11.y = (float)((((double)(float)(dVar8 / pIVar9->LogDenY[iVar4]) *
                       (pIVar5->YAxis[iVar4].Range.Max - dVar3) + dVar3) - dVar3) *
                     pIVar9->My[iVar4] + (double)pIVar9->PixelRange[iVar4].Min.y);
  this->P11 = IVar11;
  pIVar9 = GImPlot;
  pGVar6 = this->Getter2;
  dVar1 = pGVar6->XScale;
  dVar2 = pGVar6->X0;
  pTVar7 = this->Transformer;
  dVar8 = log10(pGVar6->YRef / GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar4 = pTVar7->YAxis;
  pIVar5 = pIVar9->CurrentPlot;
  dVar3 = pIVar5->YAxis[iVar4].Range.Min;
  IVar12.x = (float)(((dVar1 * 0.0 + dVar2) - (pIVar5->XAxis).Range.Min) * pIVar9->Mx +
                    (double)pIVar9->PixelRange[iVar4].Min.x);
  IVar12.y = (float)((((double)(float)(dVar8 / pIVar9->LogDenY[iVar4]) *
                       (pIVar5->YAxis[iVar4].Range.Max - dVar3) + dVar3) - dVar3) *
                     pIVar9->My[iVar4] + (double)pIVar9->PixelRange[iVar4].Min.y);
  this->P12 = IVar12;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }